

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

bool __thiscall wasm::Function::isParam(Function *this,Index index)

{
  size_t sVar1;
  ulong uVar2;
  size_type sVar3;
  Type local_28;
  ulong local_20;
  size_t size;
  Function *pFStack_10;
  Index index_local;
  Function *this_local;
  
  size._4_4_ = index;
  pFStack_10 = this;
  local_28 = getParams(this);
  sVar1 = wasm::Type::size(&local_28);
  uVar2 = (ulong)size._4_4_;
  local_20 = sVar1;
  sVar3 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::size(&this->vars);
  if (uVar2 < sVar1 + sVar3) {
    return size._4_4_ < local_20;
  }
  __assert_fail("index < size + vars.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm.cpp"
                ,0x4f8,"bool wasm::Function::isParam(Index)");
}

Assistant:

bool Function::isParam(Index index) {
  size_t size = getParams().size();
  assert(index < size + vars.size());
  return index < size;
}